

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::BasicTexSubImageCubeCase::createTexture(BasicTexSubImageCubeCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 format;
  deUint32 type;
  uint uVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int ndx;
  long lVar12;
  int iVar13;
  int face;
  long lVar14;
  uint uVar15;
  float fVar16;
  int local_120;
  long local_118;
  deUint32 tex;
  Vec4 gMax;
  Vec4 gMin;
  PixelBufferAccess local_b8;
  float local_88 [6];
  TextureFormat fmt;
  Random rnd;
  TextureLevel data;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  local_120 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar15 = (this->super_TextureSpecCase).m_width;
    uVar3 = 0x20;
    uVar10 = 0x20;
    if (uVar15 != 0) {
      uVar10 = 0x1f;
      if (uVar15 != 0) {
        for (; uVar15 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar10 = uVar10 ^ 0x1f;
    }
    uVar15 = (this->super_TextureSpecCase).m_height;
    if (uVar15 != 0) {
      uVar3 = 0x1f;
      if (uVar15 != 0) {
        for (; uVar15 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    local_120 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar10)) {
      local_120 = 0x1f - uVar10;
    }
    local_120 = local_120 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar4 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  if (local_120 != 0) {
    iVar9 = 0;
    do {
      iVar13 = (this->super_TextureSpecCase).m_width >> ((byte)iVar9 & 0x1f);
      if (iVar13 < 2) {
        iVar13 = 1;
      }
      iVar11 = (this->super_TextureSpecCase).m_height >> ((byte)iVar9 & 0x1f);
      if (iVar11 < 2) {
        iVar11 = 1;
      }
      tcu::TextureLevel::setSize(&data,iVar13,iVar11,1);
      lVar14 = 0;
      do {
        local_b8.super_ConstPixelBufferAccess.m_format.order = R;
        local_b8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_b8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_b8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        gMax.m_data[0] = 1.0;
        gMax.m_data[1] = 1.0;
        gMax.m_data[2] = 1.0;
        gMax.m_data[3] = 1.0;
        gMin.m_data[0] = 0.0;
        gMin.m_data[1] = 0.0;
        gMin.m_data[2] = 0.0;
        gMin.m_data[3] = 0.0;
        lVar12 = 0;
        do {
          fVar1 = (float)local_b8.super_ConstPixelBufferAccess.m_size.m_data[lVar12 + -2];
          fVar2 = gMax.m_data[lVar12];
          fVar16 = deRandom_getFloat(&rnd.m_rnd);
          gMin.m_data[lVar12] = (fVar2 - fVar1) * fVar16 + fVar1;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        local_b8.super_ConstPixelBufferAccess.m_format.order = R;
        local_b8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_b8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_b8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        local_88[0] = 1.0;
        local_88[1] = 1.0;
        local_88[2] = 1.0;
        local_88[3] = 1.0;
        gMax.m_data[0] = 0.0;
        gMax.m_data[1] = 0.0;
        gMax.m_data[2] = 0.0;
        gMax.m_data[3] = 0.0;
        lVar12 = 0;
        do {
          fVar1 = (float)local_b8.super_ConstPixelBufferAccess.m_size.m_data[lVar12 + -2];
          fVar2 = local_88[lVar12];
          fVar16 = deRandom_getFloat(&rnd.m_rnd);
          gMax.m_data[lVar12] = (fVar2 - fVar1) * fVar16 + fVar1;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        tcu::TextureLevel::getAccess(&local_b8,&data);
        tcu::fillWithComponentGradients(&local_b8,&gMin,&gMax);
        dVar4 = (&s_cubeMapFaces)[lVar14];
        dVar5 = this->m_format;
        dVar6 = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_b8,&data);
        sglr::ContextWrapper::glTexImage2D
                  (this_00,dVar4,iVar9,dVar5,iVar13,iVar11,0,dVar5,dVar6,
                   local_b8.super_ConstPixelBufferAccess.m_data);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 6);
      iVar9 = iVar9 + 1;
    } while (iVar9 != local_120);
    iVar9 = 0;
    do {
      uVar15 = (this->super_TextureSpecCase).m_width >> ((byte)iVar9 & 0x1f);
      if ((int)uVar15 < 2) {
        uVar15 = 1;
      }
      uVar10 = (this->super_TextureSpecCase).m_height >> ((byte)iVar9 & 0x1f);
      if ((int)uVar10 < 2) {
        uVar10 = 1;
      }
      local_118 = 0;
      do {
        dVar4 = deRandom_getUint32(&rnd.m_rnd);
        dVar5 = deRandom_getUint32(&rnd.m_rnd);
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        dVar7 = deRandom_getUint32(&rnd.m_rnd);
        iVar13 = dVar4 % uVar15 + 1;
        iVar11 = dVar5 % uVar10 + 1;
        local_b8.super_ConstPixelBufferAccess.m_format.order = R;
        local_b8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_b8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_b8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        gMax.m_data[0] = 1.0;
        gMax.m_data[1] = 1.0;
        gMax.m_data[2] = 1.0;
        gMax.m_data[3] = 1.0;
        gMin.m_data[0] = 0.0;
        gMin.m_data[1] = 0.0;
        gMin.m_data[2] = 0.0;
        gMin.m_data[3] = 0.0;
        lVar14 = 0;
        do {
          fVar1 = (float)local_b8.super_ConstPixelBufferAccess.m_size.m_data[lVar14 + -2];
          fVar2 = gMax.m_data[lVar14];
          fVar16 = deRandom_getFloat(&rnd.m_rnd);
          gMin.m_data[lVar14] = (fVar2 - fVar1) * fVar16 + fVar1;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        local_b8.super_ConstPixelBufferAccess.m_format.order = R;
        local_b8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_b8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_b8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        local_88[0] = 1.0;
        local_88[1] = 1.0;
        local_88[2] = 1.0;
        local_88[3] = 1.0;
        gMax.m_data[0] = 0.0;
        gMax.m_data[1] = 0.0;
        gMax.m_data[2] = 0.0;
        gMax.m_data[3] = 0.0;
        lVar14 = 0;
        do {
          fVar1 = (float)local_b8.super_ConstPixelBufferAccess.m_size.m_data[lVar14 + -2];
          fVar2 = local_88[lVar14];
          fVar16 = deRandom_getFloat(&rnd.m_rnd);
          gMax.m_data[lVar14] = (fVar2 - fVar1) * fVar16 + fVar1;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        dVar8 = deRandom_getUint32(&rnd.m_rnd);
        tcu::TextureLevel::setSize(&data,iVar13,iVar11,1);
        tcu::TextureLevel::getAccess(&local_b8,&data);
        tcu::fillWithGrid(&local_b8,dVar8 % 0xf + 2,&gMin,&gMax);
        dVar8 = (&s_cubeMapFaces)[local_118];
        format = this->m_format;
        type = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_b8,&data);
        sglr::ContextWrapper::glTexSubImage2D
                  (this_00,dVar8,iVar9,dVar6 % (uVar15 - dVar4 % uVar15),
                   dVar7 % (uVar10 - dVar5 % uVar10),iVar13,iVar11,format,type,
                   local_b8.super_ConstPixelBufferAccess.m_data);
        local_118 = local_118 + 1;
      } while (local_118 != 6);
      iVar9 = iVar9 + 1;
    } while (iVar9 != local_120);
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			data.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd);
				Vec4 gMax = randomVector<4>(rnd);

				tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}

		// Re-specify parts of each face and level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int		w			= rnd.getInt(1, levelW);
				int		h			= rnd.getInt(1, levelH);
				int		x			= rnd.getInt(0, levelW-w);
				int		y			= rnd.getInt(0, levelH-h);

				Vec4	colorA		= randomVector<4>(rnd);
				Vec4	colorB		= randomVector<4>(rnd);
				int		cellSize	= rnd.getInt(2, 16);

				data.setSize(w, h);
				tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

				glTexSubImage2D(s_cubeMapFaces[face], ndx, x, y, w, h, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}
	}